

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_format_duration.cpp
# Opt level: O3

void __thiscall milliseconds::test_method(milliseconds *this)

{
  int iVar1;
  duration *time;
  duration *time_00;
  duration *time_01;
  char *local_150;
  string *local_148;
  string local_140;
  undefined **local_120;
  undefined1 local_118;
  undefined8 *local_110;
  char *local_108;
  undefined8 local_100;
  undefined1 local_f8 [8];
  undefined8 local_f0;
  shared_count sStack_e8;
  undefined **local_e0;
  undefined1 local_d8;
  undefined8 *local_d0;
  string **local_c8;
  undefined **local_c0;
  undefined1 local_b8;
  undefined8 *local_b0;
  char **local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/f-koehler[P]cpp-perf/test/test_format_duration.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x1d);
  local_118 = 0;
  local_120 = &PTR__lazy_ostream_0010dc50;
  local_110 = &boost::unit_test::lazy_ostream::inst;
  local_108 = "";
  local_100 = 1000000;
  perf::format_duration_abi_cxx11_(&local_140,(perf *)&local_100,time);
  iVar1 = std::__cxx11::string::compare((char *)&local_140);
  local_f8[0] = iVar1 == 0;
  local_f0 = 0;
  sStack_e8.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/f-koehler[P]cpp-perf/test/test_format_duration.cpp"
  ;
  local_98 = "";
  local_c8 = &local_148;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0010dca0;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_150;
  local_150 = "1 ms";
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0010dd60;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_148 = &local_140;
  boost::test_tools::tt_detail::report_assertion
            (local_f8,&local_120,&local_a0,0x1d,1,2,2,"perf::format_duration(perf::milliseconds(1))"
             ,&local_e0,"\"1 ms\"",&local_c0);
  boost::detail::shared_count::~shared_count(&sStack_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/f-koehler[P]cpp-perf/test/test_format_duration.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x1e);
  local_118 = 0;
  local_120 = &PTR__lazy_ostream_0010dc50;
  local_110 = &boost::unit_test::lazy_ostream::inst;
  local_108 = "";
  local_100 = 1000000;
  perf::format_duration_abi_cxx11_(&local_140,(perf *)&local_100,time_00);
  iVar1 = std::__cxx11::string::compare((char *)&local_140);
  local_f8[0] = iVar1 == 0;
  local_f0 = 0;
  sStack_e8.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/f-koehler[P]cpp-perf/test/test_format_duration.cpp"
  ;
  local_98 = "";
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0010dca0;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_148;
  local_150 = "1 ms";
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0010dd60;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_150;
  local_148 = &local_140;
  boost::test_tools::tt_detail::report_assertion
            (local_f8,&local_120,&local_a0,0x1e,1,2,2,
             "perf::format_duration(perf::microseconds(1000))",&local_e0,"\"1 ms\"",&local_c0);
  boost::detail::shared_count::~shared_count(&sStack_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/f-koehler[P]cpp-perf/test/test_format_duration.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x1f);
  local_118 = 0;
  local_120 = &PTR__lazy_ostream_0010dc50;
  local_110 = &boost::unit_test::lazy_ostream::inst;
  local_108 = "";
  local_100 = 2000000;
  perf::format_duration_abi_cxx11_(&local_140,(perf *)&local_100,time_01);
  iVar1 = std::__cxx11::string::compare((char *)&local_140);
  local_f8[0] = iVar1 == 0;
  local_f0 = 0;
  sStack_e8.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/f-koehler[P]cpp-perf/test/test_format_duration.cpp"
  ;
  local_98 = "";
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0010dca0;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_148;
  local_150 = "2 ms";
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0010dd60;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_150;
  local_148 = &local_140;
  boost::test_tools::tt_detail::report_assertion
            (local_f8,&local_120,&local_a0,0x1f,1,2,2,
             "perf::format_duration(perf::microseconds(2000))",&local_e0,"\"2 ms\"",&local_c0);
  boost::detail::shared_count::~shared_count(&sStack_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(milliseconds)
{
    BOOST_CHECK_EQUAL(perf::format_duration(perf::milliseconds(1)), "1 ms");
    BOOST_CHECK_EQUAL(perf::format_duration(perf::microseconds(1000)), "1 ms");
    BOOST_CHECK_EQUAL(perf::format_duration(perf::microseconds(2000)), "2 ms");
}